

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::CallIndirectExpr::~CallIndirectExpr(CallIndirectExpr *this)

{
  CallIndirectExpr *this_local;
  
  (this->super_ExprMixin<(wabt::ExprType)14>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__CallIndirectExpr_0037a680;
  Var::~Var(&this->table);
  FuncDeclaration::~FuncDeclaration(&this->decl);
  ExprMixin<(wabt::ExprType)14>::~ExprMixin(&this->super_ExprMixin<(wabt::ExprType)14>);
  return;
}

Assistant:

explicit CallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::CallIndirect>(loc) {}